

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::VerifyBlocks
          (SingleFileBlockManager *this,
          unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
          *block_usage_count)

{
  size_type *__v;
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  iterator iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  unsigned_long uVar6;
  InternalException *pIVar7;
  __node_base *p_Var8;
  long local_d0;
  string missing_blocks;
  string local_a0;
  set<long,_std::less<long>,_std::allocator<long>_> referenced_blocks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::mutex::lock(&this->block_lock);
  referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_header;
  referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = &(block_usage_count->_M_h)._M_before_begin;
  p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
  referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    while( true ) {
      do {
        p_Var8 = p_Var8->_M_nxt;
        if (p_Var8 == (__node_base *)0x0) {
          for (p_Var5 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              sVar2 = referenced_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count,
              (_Rb_tree_header *)p_Var5 != p_Var1;
              p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5)) {
            ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
            _M_insert_unique<long_const&>
                      ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&referenced_blocks,(long *)(p_Var5 + 1));
          }
          uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(this->max_block);
          if (sVar2 == uVar6) {
            ::std::
            _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
            ~_Rb_tree(&referenced_blocks._M_t);
            pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
            return;
          }
          missing_blocks._M_dataplus._M_p = (pointer)&missing_blocks.field_2;
          missing_blocks._M_string_length = 0;
          missing_blocks.field_2._M_local_buf[0] = '\0';
          local_d0 = 0;
          while( true ) {
            if (this->max_block <= local_d0) break;
            iVar4 = ::std::
                    _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                    ::find(&referenced_blocks._M_t,&local_d0);
            if ((_Rb_tree_header *)iVar4._M_node ==
                &referenced_blocks._M_t._M_impl.super__Rb_tree_header) {
              if (missing_blocks._M_string_length != 0) {
                ::std::__cxx11::string::append((char *)&missing_blocks);
              }
              ::std::__cxx11::to_string(&local_a0,local_d0);
              ::std::__cxx11::string::append((string *)&missing_blocks);
              ::std::__cxx11::string::~string((string *)&local_a0);
            }
            local_d0 = local_d0 + 1;
          }
          pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_a0,
                     "Blocks %s were neither present in the free list or in the block_usage_count (max block %lld)"
                     ,(allocator *)&local_d0);
          ::std::__cxx11::string::string((string *)&local_50,(string *)&missing_blocks);
          InternalException::InternalException<std::__cxx11::string,long>
                    (pIVar7,&local_a0,&local_50,this->max_block);
          __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      } while (p_Var8[1]._M_nxt == (_Hash_node_base *)0xffffffffffffffff);
      __v = (size_type *)(p_Var8 + 1);
      if (this->max_block <= (long)p_Var8[1]._M_nxt) {
        pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&missing_blocks,
                   "Block %lld is used, but it is bigger than the max block %d",
                   (allocator *)&local_a0);
        InternalException::InternalException<long,long>
                  (pIVar7,&missing_blocks,(long)*__v,this->max_block);
        __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &referenced_blocks,(long *)__v);
      if ((_Hash_node_base *)0x1 <
          *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor) break;
      iVar4 = ::std::
              _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
              find(&(this->free_list)._M_t,(key_type_conflict *)__v);
      if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
        pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&missing_blocks,
                   "Block %lld was used, but it is present in the free list",(allocator *)&local_a0)
        ;
        InternalException::InternalException<long>(pIVar7,&missing_blocks,(long)*__v);
        __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    iVar3 = ::std::
            _Hashtable<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->multi_use_blocks)._M_h,(key_type_conflict *)__v);
    if (iVar3.super__Node_iterator_base<std::pair<const_long,_unsigned_int>,_false>._M_cur ==
        (__node_type *)0x0) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&missing_blocks,
                 "Block %lld was used %llu times, but not present in multi_use_blocks",
                 (allocator *)&local_a0);
      InternalException::InternalException<long,unsigned_long>
                (pIVar7,&missing_blocks,(long)p_Var8[1]._M_nxt,
                 (unsigned_long)
                 *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  } while (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor ==
           (_Hash_node_base *)
           (ulong)*(uint *)((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_long,_unsigned_int>,_false>
                                  ._M_cur + 0x10));
  pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&missing_blocks,
             "Block %lld was used %llu times, but multi_use_blocks says it is used %llu times",
             (allocator *)&local_a0);
  InternalException::InternalException<long,unsigned_long,unsigned_int>
            (pIVar7,&missing_blocks,(long)p_Var8[1]._M_nxt,
             (unsigned_long)
             *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor,
             *(uint *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_long,_unsigned_int>,_false>.
                             _M_cur + 0x10));
  __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::VerifyBlocks(const unordered_map<block_id_t, idx_t> &block_usage_count) {
	// probably don't need this?
	lock_guard<mutex> lock(block_lock);
	// all blocks should be accounted for - either in the block_usage_count, or in the free list
	set<block_id_t> referenced_blocks;
	for (auto &block : block_usage_count) {
		if (block.first == INVALID_BLOCK) {
			continue;
		}
		if (block.first >= max_block) {
			throw InternalException("Block %lld is used, but it is bigger than the max block %d", block.first,
			                        max_block);
		}
		referenced_blocks.insert(block.first);
		if (block.second > 1) {
			// multi-use block
			auto entry = multi_use_blocks.find(block.first);
			if (entry == multi_use_blocks.end()) {
				throw InternalException("Block %lld was used %llu times, but not present in multi_use_blocks",
				                        block.first, block.second);
			}
			if (entry->second != block.second) {
				throw InternalException(
				    "Block %lld was used %llu times, but multi_use_blocks says it is used %llu times", block.first,
				    block.second, entry->second);
			}
		} else {
			D_ASSERT(block.second > 0);
			auto entry = free_list.find(block.first);
			if (entry != free_list.end()) {
				throw InternalException("Block %lld was used, but it is present in the free list", block.first);
			}
		}
	}
	for (auto &free_block : free_list) {
		referenced_blocks.insert(free_block);
	}
	if (referenced_blocks.size() != NumericCast<idx_t>(max_block)) {
		// not all blocks are accounted for
		string missing_blocks;
		for (block_id_t i = 0; i < max_block; i++) {
			if (referenced_blocks.find(i) == referenced_blocks.end()) {
				if (!missing_blocks.empty()) {
					missing_blocks += ", ";
				}
				missing_blocks += to_string(i);
			}
		}
		throw InternalException(
		    "Blocks %s were neither present in the free list or in the block_usage_count (max block %lld)",
		    missing_blocks, max_block);
	}
}